

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

void __thiscall QAbstractScrollAreaPrivate::flashScrollBars(QAbstractScrollAreaPrivate *this)

{
  int iVar1;
  QStyle *pQVar2;
  long lVar3;
  undefined8 *puVar4;
  QStyleOptionSlider *pQVar5;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  QStyleOptionSlider QStack_98;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = &DAT_00681398;
  pQVar5 = &QStack_98;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pQVar5 = *puVar4;
    puVar4 = puVar4 + 1;
    pQVar5 = (QStyleOptionSlider *)((long)pQVar5 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&QStack_98);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->hbar,&QStack_98);
  pQVar2 = QWidget::style((QWidget *)this->hbar);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x60,&QStack_98,this->hbar,0);
  if ((this->hbarpolicy == ScrollBarAsNeeded) ||
     ((this->hbarpolicy != ScrollBarAlwaysOff && (iVar1 != 0)))) {
    QScrollBarPrivate::flash
              (*(QScrollBarPrivate **)&(this->hbar->super_QAbstractSlider).super_QWidget.field_0x8);
  }
  (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->vbar,&QStack_98);
  pQVar2 = QWidget::style((QWidget *)this->vbar);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x60,&QStack_98,this->vbar,0);
  if ((this->vbarpolicy == ScrollBarAsNeeded) ||
     ((this->vbarpolicy != ScrollBarAlwaysOff && (iVar1 != 0)))) {
    QScrollBarPrivate::flash
              (*(QScrollBarPrivate **)&(this->vbar->super_QAbstractSlider).super_QWidget.field_0x8);
  }
  QStyleOption::~QStyleOption((QStyleOption *)&QStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::flashScrollBars()
{
    QStyleOptionSlider opt;
    hbar->initStyleOption(&opt);

    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, hbar);
    if ((hbarpolicy != Qt::ScrollBarAlwaysOff) && (hbarpolicy == Qt::ScrollBarAsNeeded || htransient))
        hbar->d_func()->flash();
    vbar->initStyleOption(&opt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, vbar);
    if ((vbarpolicy != Qt::ScrollBarAlwaysOff) && (vbarpolicy == Qt::ScrollBarAsNeeded || vtransient))
        vbar->d_func()->flash();
}